

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O2

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::insert(SafeOrderList<ncnn::ObjectBox> *this,ObjectBox *value)

{
  int iVar1;
  const_iterator __position;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  __position._M_node = (_List_node_base *)this;
  do {
    __position._M_node =
         (((SafeOrderList<ncnn::ObjectBox> *)__position._M_node)->container).
         super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl._M_node.
         super__List_node_base._M_next;
    if ((SafeOrderList<ncnn::ObjectBox> *)__position._M_node == this) break;
    iVar1 = (*this->condition)(value,(ObjectBox *)(__position._M_node + 1));
  } while (iVar1 < 1);
  std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::insert
            (&this->container,__position,value);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void insert(const T &value)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end(); iter++)
    {
      if (condition(value, *iter) > 0)
        break;
    }
    container.insert(iter, value);
  }